

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<float> * __thiscall
Fad<float>::operator+=(Fad<float> *this,FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *x)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Fad<float> *pFVar7;
  Fad<float> *pFVar8;
  float *pfVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  
  pFVar7 = (x->fadexpr_).left_;
  pFVar8 = (x->fadexpr_).right_;
  uVar2 = (pFVar7->dx_).num_elts;
  uVar3 = (pFVar8->dx_).num_elts;
  uVar10 = uVar3;
  if ((int)uVar3 < (int)uVar2) {
    uVar10 = uVar2;
  }
  if (uVar10 != 0) {
    uVar4 = (this->dx_).num_elts;
    uVar12 = (ulong)uVar4;
    if (uVar12 == 0) {
      (this->dx_).num_elts = uVar10;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar10) {
        uVar12 = (long)(int)uVar10 << 2;
      }
      pfVar9 = (float *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pfVar9;
      pFVar7 = (x->fadexpr_).left_;
      iVar5 = (pFVar7->dx_).num_elts;
      if ((iVar5 == 0) || ((((x->fadexpr_).right_)->dx_).num_elts == 0)) {
        if (0 < (int)uVar10) {
          pFVar8 = (x->fadexpr_).right_;
          iVar6 = (pFVar8->dx_).num_elts;
          uVar12 = (ulong)uVar10;
          lVar13 = 0;
          do {
            pfVar15 = (float *)((long)(pFVar7->dx_).ptr_to_data + lVar13);
            if (iVar5 == 0) {
              pfVar15 = &pFVar7->defaultVal;
            }
            pfVar14 = (float *)((long)(pFVar8->dx_).ptr_to_data + lVar13);
            if (iVar6 == 0) {
              pfVar14 = &pFVar8->defaultVal;
            }
            fVar1 = pFVar8->val_;
            *(float *)((long)pfVar9 + lVar13) =
                 (*pfVar15 * fVar1 - pFVar7->val_ * *pfVar14) / (fVar1 * fVar1);
            lVar13 = lVar13 + 4;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
      }
      else if (0 < (int)uVar10) {
        pfVar15 = (pFVar7->dx_).ptr_to_data;
        pFVar8 = (x->fadexpr_).right_;
        pfVar14 = (pFVar8->dx_).ptr_to_data;
        uVar12 = 0;
        do {
          fVar1 = pFVar8->val_;
          pfVar9[uVar12] =
               (pfVar15[uVar12] * fVar1 - pFVar7->val_ * pfVar14[uVar12]) / (fVar1 * fVar1);
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
      }
    }
    else {
      pfVar9 = (this->dx_).ptr_to_data;
      if (uVar2 == 0 || uVar3 == 0) {
        if (0 < (int)uVar4) {
          lVar13 = 0;
          do {
            pfVar15 = (float *)((long)(pFVar7->dx_).ptr_to_data + lVar13);
            if (uVar2 == 0) {
              pfVar15 = &pFVar7->defaultVal;
            }
            pfVar14 = (float *)((long)(pFVar8->dx_).ptr_to_data + lVar13);
            if (uVar3 == 0) {
              pfVar14 = &pFVar8->defaultVal;
            }
            fVar1 = pFVar8->val_;
            *(float *)((long)pfVar9 + lVar13) =
                 (*pfVar15 * fVar1 - pFVar7->val_ * *pfVar14) / (fVar1 * fVar1) +
                 *(float *)((long)pfVar9 + lVar13);
            lVar13 = lVar13 + 4;
          } while (uVar12 << 2 != lVar13);
        }
      }
      else if (0 < (int)uVar4) {
        pfVar15 = (pFVar7->dx_).ptr_to_data;
        pfVar14 = (pFVar8->dx_).ptr_to_data;
        uVar11 = 0;
        do {
          fVar1 = pFVar8->val_;
          pfVar9[uVar11] =
               (pfVar15[uVar11] * fVar1 - pFVar7->val_ * pfVar14[uVar11]) / (fVar1 * fVar1) +
               pfVar9[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
    }
  }
  this->val_ = ((x->fadexpr_).left_)->val_ / ((x->fadexpr_).right_)->val_ + this->val_;
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator+= (const FadExpr<ExprT>& x)
{
  int xsz = x.size(), sz = dx_.size();

  if (xsz) {
    if (sz) {
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.fastAccessDx(i);
      else
	for (int i=0; i<sz; ++i)
	  dxp[i] += x.dx(i);
    }
    else {
      dx_.resize(xsz);
      T* RESTRICT dxp = dx_.begin();
      if (x.hasFastAccess())
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.fastAccessDx(i);
      else
	for (int i=0; i<xsz; ++i)
	  dxp[i] = x.dx(i);
    }
  }

  val_ += x.val();

  return *this;
}